

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deviceinfo.cc
# Opt level: O3

void __thiscall rcdiscover::DeviceInfo::clear(DeviceInfo *this)

{
  (this->manufacturer_name)._M_string_length = 0;
  this->major = 0;
  this->minor = 0;
  this->mac = 0;
  *(undefined8 *)((long)&this->mac + 4) = 0;
  this->subnet = 0;
  this->gateway = 0;
  *(this->manufacturer_name)._M_dataplus._M_p = '\0';
  (this->model_name)._M_string_length = 0;
  *(this->model_name)._M_dataplus._M_p = '\0';
  (this->device_version)._M_string_length = 0;
  *(this->device_version)._M_dataplus._M_p = '\0';
  (this->manufacturer_info)._M_string_length = 0;
  *(this->manufacturer_info)._M_dataplus._M_p = '\0';
  (this->serial_number)._M_string_length = 0;
  *(this->serial_number)._M_dataplus._M_p = '\0';
  (this->user_name)._M_string_length = 0;
  *(this->user_name)._M_dataplus._M_p = '\0';
  return;
}

Assistant:

void DeviceInfo::clear()
{
  major=minor=0;
  mac=0;
  ip=0;
  subnet=0;
  gateway=0;

  manufacturer_name.erase();
  model_name.erase();
  device_version.erase();
  manufacturer_info.erase();
  serial_number.erase();
  user_name.erase();
}